

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacPtrAbc.c
# Opt level: O2

Vec_Ptr_t * Ptr_AbcDeriveOutputs(Abc_Ntk_t *pNtk)

{
  Vec_Ptr_t *vArray;
  Abc_Obj_t *pObj;
  char *Entry;
  int i;
  
  vArray = Vec_PtrAllocExact(pNtk->vPos->nSize);
  for (i = 0; i < pNtk->vPos->nSize; i = i + 1) {
    pObj = Abc_NtkPo(pNtk,i);
    Entry = Ptr_AbcObjName(pObj);
    Vec_PtrPush(vArray,Entry);
  }
  Ptr_CheckArray(vArray);
  return vArray;
}

Assistant:

Vec_Ptr_t * Ptr_AbcDeriveOutputs( Abc_Ntk_t * pNtk )
{
    Abc_Obj_t * pObj; int i;
    Vec_Ptr_t * vSigs = Vec_PtrAllocExact( Abc_NtkPoNum(pNtk) );
    Abc_NtkForEachPo( pNtk, pObj, i )
        Vec_PtrPush( vSigs, Ptr_AbcObjName(pObj) );
    assert( Ptr_CheckArray(vSigs) );
    return vSigs;
}